

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O0

int foldconstants(optype intopcode,addressrec a,addressrec b,addressrec c)

{
  datatype dVar1;
  undefined4 local_28;
  int nextop;
  optype intopcode_local;
  addressrec c_local;
  addressrec b_local;
  addressrec a_local;
  
  c_local.opnd = b.opnd;
  dVar1 = data_class(c_local.opnd);
  if (dVar1 == dtreal) {
    local_28 = foldrconstants(intopcode,a,b,c);
  }
  else {
    local_28 = foldiconstants(intopcode,a,b,c);
  }
  didcalculation = 1;
  return local_28;
}

Assistant:

int	foldconstants(enum optype intopcode, struct addressrec a,
                  struct addressrec b, struct addressrec c)
{
    int	nextop;
    
    if (data_class(b.opnd) == dtreal)
        nextop = foldrconstants(intopcode, a, b, c);
    else
        nextop = foldiconstants(intopcode, a, b, c);
    didcalculation = YES;
    return(nextop);
}